

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O1

psa_status_t psa_open_key(psa_key_file_id_t id,psa_key_handle_t *handle)

{
  psa_status_t pVar1;
  ushort uVar2;
  psa_key_slot_t *unaff_R14;
  bool bVar3;
  size_t key_data_length;
  uint8_t *key_data;
  size_t local_28;
  uint8_t *local_20;
  
  *handle = 0;
  pVar1 = -0x87;
  if (0 < (int)id) {
    if ((global_data._1536_1_ & 1) == 0) {
      pVar1 = -0x89;
      bVar3 = false;
    }
    else {
      *handle = 0x20;
      uVar2 = 0x20;
      pVar1 = 0;
      do {
        bVar3 = global_data.key_slots[uVar2 - 1].attr.type == 0;
        if (bVar3) {
          unaff_R14 = global_data.key_slots + (uVar2 - 1);
          goto LAB_00113536;
        }
        uVar2 = uVar2 - 1;
        *handle = uVar2;
      } while (uVar2 != 0);
      pVar1 = -0x8d;
      unaff_R14 = (psa_key_slot_t *)0x0;
    }
LAB_00113536:
    if (bVar3) {
      (unaff_R14->attr).lifetime = 1;
      (unaff_R14->attr).id = id;
      local_20 = (uint8_t *)0x0;
      local_28 = 0;
      pVar1 = psa_load_persistent_key(&unaff_R14->attr,&local_20,&local_28);
      if (pVar1 == 0) {
        pVar1 = psa_import_key_into_slot(unaff_R14,local_20,local_28);
      }
      psa_free_persistent_key_data(local_20,local_28);
      if (pVar1 != 0) {
        psa_wipe_key_slot(unaff_R14);
        *handle = 0;
      }
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_open_key( psa_key_file_id_t id, psa_key_handle_t *handle )
{
#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    psa_status_t status;
    psa_key_slot_t *slot;

    *handle = 0;

    status = psa_validate_persistent_key_parameters(
        PSA_KEY_LIFETIME_PERSISTENT, id, NULL, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_empty_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    slot->attr.lifetime = PSA_KEY_LIFETIME_PERSISTENT;
    slot->attr.id = id;

    status = psa_load_persistent_key_into_slot( slot );
    if( status != PSA_SUCCESS )
    {
        psa_wipe_key_slot( slot );
        *handle = 0;
    }
    return( status );

#else /* defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
    (void) id;
    *handle = 0;
    return( PSA_ERROR_NOT_SUPPORTED );
#endif /* !defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
}